

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

cl_int xmrig::OclLib::release(cl_context context)

{
  cl_int ret;
  char *pcVar1;
  
  ret = (*pReleaseContext)(context);
  if (ret != 0) {
    pcVar1 = OclError::toString(ret);
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar1,"clReleaseContext");
  }
  return ret;
}

Assistant:

cl_int xmrig::OclLib::release(cl_context context) noexcept
{
    assert(pReleaseContext != nullptr);

    LOG_REFS("%p %u ~context", context, getUint(context, CL_CONTEXT_REFERENCE_COUNT));

    const cl_int ret = pReleaseContext(context);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseContext);
    }

    return ret;
}